

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void Logger::Write(LogLevel logLevel,string *str)

{
  ostream *poVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  string *str_local;
  LogLevel logLevel_local;
  
  l._M_device = (mutex_type *)str;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&s_mutex);
  if (logLevel == Info) {
    std::operator<<((ostream *)&std::cerr,"[Info] ");
  }
  else if (logLevel == Error) {
    std::operator<<((ostream *)&std::cerr,"[Error] ");
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"[LogLevel: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,logLevel);
    std::operator<<(poVar1,"] ");
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)str);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void Logger::Write(LogLevel logLevel, std::string str)
{
    std::lock_guard<std::mutex> l(s_mutex);
    switch (logLevel)
    {
    case LogLevel::Info:
        std::cerr << "[Info] ";
        break;
    case LogLevel::Error:
        std::cerr << "[Error] ";
        break;
    default:
        std::cerr << "[LogLevel: " << static_cast<std::underlying_type<LogLevel>::type>(logLevel) << "] ";
        break;
    }
    std::cerr << str << std::endl;
}